

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,TagDeclarationSymbol *tagTyDecl)

{
  TagDeclarationCategory TVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  char *pcVar4;
  
  do {
    if (tagTyDecl == (TagDeclarationSymbol *)0x0) {
      pcVar4 = "<TagTypeDeclaration is null>";
LAB_002ff596:
      poVar3 = std::operator<<(os,pcVar4);
      return poVar3;
    }
    TVar1 = TagDeclarationSymbol::category(tagTyDecl);
    if (TVar1 != StructOrUnion) {
      if (TVar1 == Enum) {
        iVar2 = (*(tagTyDecl->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
                  _vptr_Symbol[0x1b])(tagTyDecl);
        poVar3 = operator<<(os,(EnumDeclarationSymbol *)CONCAT44(extraout_var_00,iVar2));
        return poVar3;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x85);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,"<empty message>");
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar4 = "<invalid TagTypeDeclaration>";
      goto LAB_002ff596;
    }
    iVar2 = (*(tagTyDecl->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
              _vptr_Symbol[0x1d])(tagTyDecl);
    tagTyDecl = (TagDeclarationSymbol *)CONCAT44(extraout_var,iVar2);
  } while( true );
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const TagDeclarationSymbol* tagTyDecl)
{
    if (!tagTyDecl)
        return os << "<TagTypeDeclaration is null>";
    switch (tagTyDecl->category()) {
        case TagDeclarationCategory::StructOrUnion:
            return os << tagTyDecl->asStructOrUnionDeclaration();
        case TagDeclarationCategory::Enum:
            return os << tagTyDecl->asEnumDeclaration();
    }
    PSY_ASSERT_1(false);
    return os << "<invalid TagTypeDeclaration>";
}